

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

uncertain_measurement units::root(uncertain_measurement *um,int power)

{
  int in_ESI;
  uncertain_measurement *in_RDI;
  unit *puVar1;
  double dVar2;
  double dVar3;
  double new_tol;
  double new_value;
  undefined8 in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  int local_54;
  unit local_38;
  double local_30;
  unit *local_28;
  int local_1c;
  uncertain_measurement *local_18;
  uncertain_measurement local_10;
  
  local_1c = in_ESI;
  local_18 = in_RDI;
  uncertain_measurement::value(in_RDI);
  puVar1 = (unit *)numericalRoot<double>
                             (in_stack_ffffffffffffff98,
                              (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  local_28 = puVar1;
  dVar2 = uncertain_measurement::uncertainty(local_18);
  if (local_1c < 0) {
    local_54 = -local_1c;
  }
  else {
    local_54 = local_1c;
  }
  dVar3 = uncertain_measurement::value(local_18);
  dVar2 = ((double)puVar1 * dVar2) / ((double)local_54 * dVar3);
  puVar1 = local_28;
  local_30 = dVar2;
  uncertain_measurement::units(local_18);
  local_38 = root(puVar1,(int)((ulong)(double)local_54 >> 0x20));
  uncertain_measurement::uncertain_measurement(&local_10,(double)puVar1,dVar2,&local_38);
  return local_10;
}

Assistant:

uncertain_measurement root(const uncertain_measurement& um, int power)
{
    auto new_value = numericalRoot(um.value(), power);
    auto new_tol = new_value * um.uncertainty() /
        (static_cast<double>((power >= 0) ? power : -power) * um.value());
    return uncertain_measurement(new_value, new_tol, root(um.units(), power));
}